

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_read.c
# Opt level: O3

size_t mpt_message_read(mpt_message *msg,size_t len,void *dest)

{
  iovec *piVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong __n;
  
  __n = msg->used;
  sVar4 = 0;
  if (__n < len) {
    do {
      if (__n != 0) {
        if (dest == (void *)0x0) {
          dest = (void *)0x0;
        }
        else {
          memcpy(dest,msg->base,__n);
          dest = (void *)((long)dest + __n);
        }
        sVar4 = sVar4 + __n;
        len = len - __n;
      }
      if (msg->clen == 0) {
        msg->base = (void *)((long)msg->base + __n);
        msg->used = msg->used - __n;
        return sVar4;
      }
      piVar1 = msg->cont;
      __n = piVar1->iov_len;
      msg->used = __n;
      msg->base = piVar1->iov_base;
      msg->cont = piVar1 + 1;
      msg->clen = msg->clen - 1;
    } while (__n < len);
  }
  if (len != 0) {
    if (dest != (void *)0x0) {
      memcpy(dest,msg->base,len);
      __n = msg->used;
    }
    msg->base = (void *)((long)msg->base + len);
    __n = __n - len;
    msg->used = __n;
  }
  if (__n == 0) {
    sVar3 = msg->clen;
    do {
      sVar3 = sVar3 - 1;
      if (sVar3 == 0xffffffffffffffff) break;
      piVar1 = msg->cont;
      sVar2 = piVar1->iov_len;
      msg->used = sVar2;
      msg->base = piVar1->iov_base;
      msg->cont = piVar1 + 1;
      msg->clen = sVar3;
    } while (sVar2 == 0);
  }
  return sVar4 + len;
}

Assistant:

extern size_t mpt_message_read(MPT_STRUCT(message) *msg, size_t len, void *dest)
{
	size_t total = 0, part;
	
	while (len > (part = msg->used)) {
		if (part) {
			if (dest) {
				memcpy(dest, msg->base, part);
				dest = ((uint8_t *) dest) + part;
			}
			total += part;
			len   -= part;
		}
		if (!msg->clen) {
			msg->base = ((uint8_t *) msg->base) + part;
			msg->used -= part;
			return total;
		}
		msg->used = msg->cont->iov_len;
		msg->base = msg->cont->iov_base;
		++msg->cont;
		--msg->clen;
	}
	if (len) {
		if (dest) memcpy(dest, msg->base, len);
		msg->base = ((uint8_t *) msg->base) + len;
		msg->used -= len;
	}
	while (!msg->used && msg->clen) {
		msg->used = msg->cont->iov_len;
		msg->base = msg->cont->iov_base;
		++msg->cont;
		--msg->clen;
	}
	
	return total + len;
}